

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEdit::setCurrentSection(QDateTimeEdit *this,Section section)

{
  bool bVar1;
  Section s;
  Section SVar2;
  QDateTimeEditPrivate *pQVar3;
  qsizetype qVar4;
  Section in_ESI;
  long in_FS_OFFSET;
  int i;
  int index;
  int size;
  QDateTimeEditPrivate *d;
  undefined8 in_stack_ffffffffffffff98;
  QFlagsStorage<QDateTimeEdit::Section> f2;
  QDateTimeEditPrivate *this_00;
  QVariant *val;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar6;
  int local_48;
  undefined1 local_28 [24];
  Int local_10;
  QFlagsStorageHelper<QDateTimeEdit::Section,_4> local_c;
  long local_8;
  
  f2.i = (Int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QDateTimeEdit *)0x559ab9);
  uVar5 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
  if (in_ESI != NoSection) {
    local_10 = (pQVar3->sections).super_QFlagsStorageHelper<QDateTimeEdit::Section,_4>.
               super_QFlagsStorage<QDateTimeEdit::Section>.i;
    local_c.super_QFlagsStorage<QDateTimeEdit::Section>.i =
         (QFlagsStorage<QDateTimeEdit::Section>)
         ::operator&(NoSection,(QFlags<QDateTimeEdit::Section>)f2.i);
    bVar1 = QFlags<QDateTimeEdit::Section>::operator!((QFlags<QDateTimeEdit::Section> *)&local_c);
    uVar5 = CONCAT13(bVar1,(int3)uVar5);
  }
  if ((char)((uint)uVar5 >> 0x18) == '\0') {
    val = &(pQVar3->super_QAbstractSpinBoxPrivate).value;
    this_00 = pQVar3;
    (**(code **)(*(long *)&(pQVar3->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x110))
              (local_28);
    QDateTimeEditPrivate::updateCache
              ((QDateTimeEditPrivate *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),val,
               (QString *)this_00);
    QString::~QString((QString *)0x559b53);
    qVar4 = QList<QDateTimeParser::SectionNode>::size
                      ((QList<QDateTimeParser::SectionNode> *)&pQVar3->field_0x408);
    local_48 = *(int *)&pQVar3->field_0x3e0 + 1;
    for (iVar6 = 0; iVar6 < 2; iVar6 = iVar6 + 1) {
      for (; local_48 < (int)qVar4; local_48 = local_48 + 1) {
        s = QDateTimeParser::sectionType((int)pQVar3 + 0x3d8);
        SVar2 = QDateTimeEditPrivate::convertToPublic(s);
        if (SVar2 == in_ESI) {
          iVar6 = (int)((ulong)(pQVar3->super_QAbstractSpinBoxPrivate).edit >> 0x20);
          QDateTimeParser::sectionPos((int)pQVar3 + 0x3d8);
          QLineEdit::setCursorPosition((QLineEdit *)this_00,iVar6);
          goto LAB_00559c16;
        }
      }
      local_48 = 0;
    }
  }
LAB_00559c16:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEdit::setCurrentSection(Section section)
{
    Q_D(QDateTimeEdit);
    if (section == NoSection || !(section & d->sections))
        return;

    d->updateCache(d->value, d->displayText());
    const int size = d->sectionNodes.size();
    int index = d->currentSectionIndex + 1;
    for (int i=0; i<2; ++i) {
        while (index < size) {
            if (QDateTimeEditPrivate::convertToPublic(d->sectionType(index)) == section) {
                d->edit->setCursorPosition(d->sectionPos(index));
                QDTEDEBUG << d->sectionPos(index);
                return;
            }
            ++index;
        }
        index = 0;
    }
}